

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Apu.cpp
# Opt level: O3

void __thiscall Ay_Apu::run_until(Ay_Apu *this,blip_time_t final_end_time)

{
  Blip_Synth<12,_1> *this_00;
  osc_t *poVar1;
  blargg_ulong bVar2;
  int iVar3;
  Blip_Buffer *buf;
  long lVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  bool bVar18;
  uint uVar19;
  int t;
  uint uVar20;
  int t_00;
  bool bVar21;
  
  uVar8 = (this->regs[6] & 0x1f) << 5;
  if ((this->regs[6] & 0x1f) == 0) {
    uVar8 = 0x20;
  }
  uVar12 = (uint)this->regs[0xb] << 5 | (uint)this->regs[0xc] << 0xd;
  if (uVar12 == 0) {
    uVar12 = 0x20;
  }
  if ((this->env).delay == 0) {
    (this->env).delay = uVar12;
  }
  iVar11 = (this->noise).delay;
  bVar2 = (this->noise).lfsr;
  this_00 = &this->synth_;
  lVar14 = 0;
  do {
    buf = this->oscs[lVar14].output;
    if (buf != (Blip_Buffer *)0x0) {
      poVar1 = this->oscs + lVar14;
      bVar5 = this->regs[7] >> ((byte)lVar14 & 0x1f);
      buf->modified_ = 1;
      iVar3 = poVar1->period;
      bVar18 = (bVar5 & 1) == 0 && iVar3 <= (int)((int)buf->clock_rate_ + 0x4000U >> 0xf);
      uVar19 = (uint)(bVar18 | bVar5);
      iVar17 = this->last_time;
      iVar10 = (this->env).pos;
      iVar13 = final_end_time;
      if ((this->regs[lVar14 + 8] & 0x10) == 0) {
        bVar5 = ""[this->regs[lVar14 + 8] & 0xf] >> bVar18;
        uVar6 = (uint)bVar5;
LAB_006ea8f6:
        if (bVar5 == 0) {
          uVar19 = 9;
        }
      }
      else {
        bVar5 = (this->env).wave[iVar10] >> bVar18;
        uVar6 = (uint)bVar5;
        if (-0x21 < iVar10 && (this->regs[0xd] & 1) != 0) goto LAB_006ea8f6;
        iVar13 = (this->env).delay + iVar17;
        if (final_end_time <= iVar13) {
          iVar13 = final_end_time;
        }
      }
      t = poVar1->delay + iVar17;
      uVar7 = uVar19 & 1;
      if (uVar7 != 0) {
        lVar4 = (long)((final_end_time + -1 + iVar3) - t) / (long)iVar3;
        t = t + (int)lVar4 * iVar3;
        poVar1->phase = poVar1->phase ^ (ushort)lVar4 & 1;
      }
      bVar21 = (uVar19 & 8) != 0;
      t_00 = iVar17 + iVar11;
      if (bVar21) {
        t_00 = final_end_time;
      }
      uVar20 = 1;
      if (!bVar21) {
        uVar20 = bVar2;
      }
      while( true ) {
        iVar9 = iVar13;
        uVar16 = -((uVar20 | uVar19 >> 3) & ((ushort)poVar1->phase | uVar19) & 1) & uVar6;
        iVar13 = uVar16 - (int)poVar1->last_amp;
        if (iVar13 != 0) {
          poVar1->last_amp = (short)uVar16;
          Blip_Synth<12,_1>::offset(this_00,iVar17,iVar13,buf);
        }
        if ((t_00 < iVar9) || (t < iVar9)) {
          iVar17 = uVar16 * 2 - uVar6;
          bVar21 = iVar17 != 0;
          uVar16 = (ushort)poVar1->phase | uVar7;
          do {
            iVar13 = t;
            if (iVar9 < t) {
              iVar13 = iVar9;
            }
            if ((bVar21 & uVar16) == 0) {
              uVar15 = iVar13 - t_00;
              if (-1 < (int)uVar15) {
                t_00 = (t_00 + uVar8 + uVar15) - uVar15 % uVar8;
              }
            }
            else {
              for (; t_00 <= iVar13; t_00 = t_00 + uVar8) {
                if ((uVar20 + 1 & 2) != 0) {
                  iVar17 = -iVar17;
                  Blip_Synth<12,_1>::offset(this_00,t_00,iVar17,buf);
                }
                uVar20 = uVar20 >> 1 ^ -(uVar20 & 1) & 0x12000;
              }
            }
            iVar13 = t_00;
            if (iVar9 < t_00) {
              iVar13 = iVar9;
            }
            if ((bVar21 & uVar20) == 0) {
              for (; t < iVar13; t = t + iVar3) {
                uVar16 = uVar16 ^ 1;
              }
            }
            else {
              for (; t < iVar13; t = t + iVar3) {
                iVar17 = -iVar17;
                Blip_Synth<12,_1>::offset(this_00,t,iVar17,buf);
              }
              uVar16 = (uint)(0 < iVar17);
            }
          } while ((t_00 < iVar9) || (t < iVar9));
          poVar1->last_amp = (short)(iVar17 + uVar6 >> 1);
          if (uVar7 == 0) {
            poVar1->phase = (short)uVar16;
          }
        }
        if (final_end_time <= iVar9) break;
        iVar10 = iVar10 + (uint)(iVar10 < -1) * 0x20 + -0x1f;
        uVar6 = (uint)((this->env).wave[iVar10] >> bVar18);
        iVar13 = iVar9 + uVar12;
        iVar17 = iVar9;
        if (final_end_time <= (int)(iVar9 + uVar12)) {
          iVar13 = final_end_time;
        }
      }
      poVar1->delay = t - final_end_time;
      if ((uVar19 & 8) == 0) {
        (this->noise).delay = t_00 - final_end_time;
        (this->noise).lfsr = uVar20;
      }
    }
    lVar14 = lVar14 + 1;
    if (lVar14 == 3) {
      iVar11 = final_end_time - (this->last_time + (this->env).delay);
      if (-1 < iVar11) {
        uVar19 = (iVar11 + uVar12) / uVar12;
        uVar6 = (this->env).pos + uVar19;
        uVar8 = uVar6 | 0xffffffe0;
        if ((int)uVar6 < 0) {
          uVar8 = uVar6;
        }
        (this->env).pos = uVar8;
        iVar11 = iVar11 - uVar19 * uVar12;
      }
      (this->env).delay = -iVar11;
      this->last_time = final_end_time;
      return;
    }
  } while( true );
}

Assistant:

void Ay_Apu::run_until( blip_time_t final_end_time )
{
	require( final_end_time >= last_time );
	
	// noise period and initial values
	blip_time_t const noise_period_factor = period_factor * 2; // verified
	blip_time_t noise_period = (regs [6] & 0x1F) * noise_period_factor;
	if ( !noise_period )
		noise_period = noise_period_factor;
	blip_time_t const old_noise_delay = noise.delay;
	blargg_ulong const old_noise_lfsr = noise.lfsr;
	
	// envelope period
	blip_time_t const env_period_factor = period_factor * 2; // verified
	blip_time_t env_period = (regs [12] * 0x100L + regs [11]) * env_period_factor;
	if ( !env_period )
		env_period = env_period_factor; // same as period 1 on my AY chip
	if ( !env.delay )
		env.delay = env_period;
	
	// run each osc separately
	for ( int index = 0; index < osc_count; index++ )
	{
		osc_t* const osc = &oscs [index];
		int osc_mode = regs [7] >> index;
		
		// output
		Blip_Buffer* const osc_output = osc->output;
		if ( !osc_output )
			continue;
		osc_output->set_modified();
		
		// period
		int half_vol = 0;
		blip_time_t inaudible_period = (blargg_ulong) (osc_output->clock_rate() +
				inaudible_freq) / (inaudible_freq * 2);
		if ( osc->period <= inaudible_period && !(osc_mode & tone_off) )
		{
			half_vol = 1; // Actually around 60%, but 50% is close enough
			osc_mode |= tone_off;
		}
		
		// envelope
		blip_time_t start_time = last_time;
		blip_time_t end_time   = final_end_time;
		int const vol_mode = regs [0x08 + index];
		int volume = amp_table [vol_mode & 0x0F] >> half_vol;
		int osc_env_pos = env.pos;
		if ( vol_mode & 0x10 )
		{
			volume = env.wave [osc_env_pos] >> half_vol;
			// use envelope only if it's a repeating wave or a ramp that hasn't finished
			if ( !(regs [13] & 1) || osc_env_pos < -32 )
			{
				end_time = start_time + env.delay;
				if ( end_time >= final_end_time )
					end_time = final_end_time;
				
				//if ( !(regs [12] | regs [11]) )
				//  debug_printf( "Used envelope period 0\n" );
			}
			else if ( !volume )
			{
				osc_mode = noise_off | tone_off;
			}
		}
		else if ( !volume )
		{
			osc_mode = noise_off | tone_off;
		}
		
		// tone time
		blip_time_t const period = osc->period;
		blip_time_t time = start_time + osc->delay;
		if ( osc_mode & tone_off ) // maintain tone's phase when off
		{
			blargg_long count = (final_end_time - time + period - 1) / period;
			time += count * period;
			osc->phase ^= count & 1;
		}
		
		// noise time
		blip_time_t ntime = final_end_time;
		blargg_ulong noise_lfsr = 1;
		if ( !(osc_mode & noise_off) )
		{
			ntime = start_time + old_noise_delay;
			noise_lfsr = old_noise_lfsr;
			//if ( (regs [6] & 0x1F) == 0 )
			//  debug_printf( "Used noise period 0\n" );
		}
		
		// The following efficiently handles several cases (least demanding first):
		// * Tone, noise, and envelope disabled, where channel acts as 4-bit DAC
		// * Just tone or just noise, envelope disabled
		// * Envelope controlling tone and/or noise
		// * Tone and noise disabled, envelope enabled with high frequency
		// * Tone and noise together
		// * Tone and noise together with envelope
		
		// This loop only runs one iteration if envelope is disabled. If envelope
		// is being used as a waveform (tone and noise disabled), this loop will
		// still be reasonably efficient since the bulk of it will be skipped.
		while ( 1 )
		{
			// current amplitude
			int amp = 0;
			if ( (osc_mode | osc->phase) & 1 & (osc_mode >> 3 | noise_lfsr) )
				amp = volume;
			{
				int delta = amp - osc->last_amp;
				if ( delta )
				{
					osc->last_amp = amp;
					synth_.offset( start_time, delta, osc_output );
				}
			}
			
			// Run wave and noise interleved with each catching up to the other.
			// If one or both are disabled, their "current time" will be past end time,
			// so there will be no significant performance hit.
			if ( ntime < end_time || time < end_time )
			{
				// Since amplitude was updated above, delta will always be +/- volume,
				// so we can avoid using last_amp every time to calculate the delta.
				int delta = amp * 2 - volume;
				int delta_non_zero = delta != 0;
				int phase = osc->phase | (osc_mode & tone_off); assert( tone_off == 0x01 );
				do
				{
					// run noise
					blip_time_t end = end_time;
					if ( end_time > time ) end = time;
					if ( phase & delta_non_zero )
					{
						while ( ntime <= end ) // must advance *past* time to avoid hang
						{
							int changed = noise_lfsr + 1;
							noise_lfsr = ((blargg_ulong)-(blargg_long)(noise_lfsr & 1) & 0x12000) ^ (noise_lfsr >> 1);
							if ( changed & 2 )
							{
								delta = -delta;
								synth_.offset( ntime, delta, osc_output );
							}
							ntime += noise_period;
						}
					}
					else
					{
						// 20 or more noise periods on average for some music
						blargg_long remain = end - ntime;
						blargg_long count = remain / noise_period;
						if ( remain >= 0 )
							ntime += noise_period + count * noise_period;
					}
					
					// run tone
					end = end_time;
					if ( end_time > ntime ) end = ntime;
					if ( noise_lfsr & delta_non_zero )
					{
						while ( time < end )
						{
							delta = -delta;
							synth_.offset( time, delta, osc_output );
							time += period;
							//phase ^= 1;
						}
						//assert( phase == (delta > 0) );
						phase = unsigned (-delta) >> (CHAR_BIT * sizeof (unsigned) - 1);
						// (delta > 0)
					}
					else
					{
						// loop usually runs less than once
						//SUB_CASE_COUNTER( (time < end) * (end - time + period - 1) / period );
						
						while ( time < end )
						{
							time += period;
							phase ^= 1;
						}
					}
				}
				while ( time < end_time || ntime < end_time );
				
				osc->last_amp = (delta + volume) >> 1;
				if ( !(osc_mode & tone_off) )
					osc->phase = phase;
			}
			
			if ( end_time >= final_end_time )
				break; // breaks first time when envelope is disabled
			
			// next envelope step
			if ( ++osc_env_pos >= 0 )
				osc_env_pos -= 32;
			volume = env.wave [osc_env_pos] >> half_vol;
			
			start_time = end_time;
			end_time += env_period;
			if ( end_time > final_end_time )
				end_time = final_end_time;
		}
		osc->delay = time - final_end_time;
		
		if ( !(osc_mode & noise_off) )
		{
			noise.delay = ntime - final_end_time;
			noise.lfsr = noise_lfsr;
		}
	}
	
	// TODO: optimized saw wave envelope?
	
	// maintain envelope phase
	blip_time_t remain = final_end_time - last_time - env.delay;
	if ( remain >= 0 )
	{
		blargg_long count = (remain + env_period) / env_period;
		env.pos += count;
		if ( env.pos >= 0 )
			env.pos = (env.pos & 31) - 32;
		remain -= count * env_period;
		assert( -remain <= env_period );
	}
	env.delay = -remain;
	assert( env.delay > 0 );
	assert( env.pos < 0 );
	
	last_time = final_end_time;
}